

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

bool __thiscall CMU462::DynamicScene::Scene::removeObject(Scene *this,SceneObject *o)

{
  iterator iVar1;
  _Rb_tree_header *p_Var2;
  SceneObject *local_20;
  
  local_20 = o;
  iVar1 = std::
          _Rb_tree<CMU462::DynamicScene::SceneObject_*,_CMU462::DynamicScene::SceneObject_*,_std::_Identity<CMU462::DynamicScene::SceneObject_*>,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          ::find(&(this->objects)._M_t,&local_20);
  p_Var2 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node != p_Var2) {
    std::
    _Rb_tree<CMU462::DynamicScene::SceneObject_*,_CMU462::DynamicScene::SceneObject_*,_std::_Identity<CMU462::DynamicScene::SceneObject_*>,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
    ::erase(&(this->objects)._M_t,&local_20);
  }
  return (_Rb_tree_header *)iVar1._M_node != p_Var2;
}

Assistant:

bool Scene::removeObject(SceneObject *o) {
  auto i = objects.find(o);
  if (i == objects.end()) {
    return false;
  }

  objects.erase(o);
  return true;
}